

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

void __thiscall
unodb::
olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
::
decrement_inode_count<unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
           *this)

{
  olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
  *poVar1;
  long lVar2;
  
  LOCK();
  poVar1 = this + 400;
  lVar2 = *(long *)poVar1;
  *(long *)poVar1 = *(long *)poVar1 + -1;
  UNLOCK();
  if (lVar2 == 0) {
    __assert_fail("old_inode_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xaa3,
                  "void unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::decrement_inode_count() [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<std::span<const std::byte>, std::span<const std::byte>>]"
                 );
  }
  if (0xbf < *(ulong *)(this + 0x80)) {
    LOCK();
    *(long *)(this + 0x80) = *(long *)(this + 0x80) + -0xc0;
    UNLOCK();
    return;
  }
  __assert_fail("delta <= current_memory_use.load(std::memory_order_relaxed)",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0xa8e,
                "void unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::decrease_memory_use(std::size_t) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

constexpr void olc_db<Key, Value>::decrement_inode_count() noexcept {
  static_assert(detail::olc_inode_defs<Key, Value>::template is_inode<INode>());

  const auto old_inode_count UNODB_DETAIL_USED_IN_DEBUG =
      node_counts[as_i<INode::type>].fetch_sub(1, std::memory_order_relaxed);
  UNODB_DETAIL_ASSERT(old_inode_count > 0);

  decrease_memory_use(sizeof(INode));
}